

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suprun.c
# Opt level: O2

void sup_log_undefobj(mcmcxdef *mctx,errcxdef *ec,int err,char *nm,int nmlen,objnum objn)

{
  objnum oVar1;
  uchar *puVar2;
  size_t sVar3;
  char *pcVar4;
  
  oVar1 = objget1sc(mctx,objn);
  if (oVar1 != 0xffff) {
    return;
  }
  puVar2 = mcmlck(mctx,objn);
  sVar3 = strlen((char *)(puVar2 + 0xe));
  pcVar4 = errstr(ec,nm,nmlen);
  ec->errcxptr->erraav[0].errastr = pcVar4;
  pcVar4 = errstr(ec,(char *)(puVar2 + 0xe),(int)sVar3);
  ec->errcxptr->erraav[1].errastr = pcVar4;
  ec->errcxptr->erraac = 2;
  errlogn(ec,err,"TADS");
  mcmunlck(mctx,objn);
  return;
}

Assistant:

void sup_log_undefobj(mcmcxdef *mctx, errcxdef *ec, int err,
                      char *nm, int nmlen, objnum objn)
{
    uchar  *p;
    size_t  len;

    /* 
     *   if the object has any superclasses defined, what must have
     *   happened is that we encountered an error in the course of
     *   defining the object; the object is partially defined, hence it
     *   won't show up in our records of defined objects, yet it really
     *   shouldn't count as an undefined object; simply suppress the
     *   message in this case 
     */
    if (objget1sc(mctx, objn) != MCMONINV)
        return;

    /* get the object - it contains the location where it was defined */
    p = mcmlck(mctx, (mcmon)objn);

    /* skip the object header */
    p += OBJDEFSIZ;

    /* get the length of the name */
    len = strlen((char *)p);

#ifdef OS_ERRLINE
    len += strlen((char *)p + len + 1);
#endif

    /* log the error */
    errlog2(ec, err, ERRTSTR, errstr(ec, nm, nmlen),
            ERRTSTR, errstr(ec, (char *)p, len));

    /* done with the object */
    mcmunlck(mctx, (mcmon)objn);
}